

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMalformedImages.cpp
# Opt level: O2

void anon_unknown.dwarf_1625eb::readImage(char *inFileName)

{
  int scanLine2;
  int iVar1;
  ostream *poVar2;
  Header *other;
  Box2i *pBVar3;
  size_t yStride;
  long lVar4;
  allocator<char> local_a9;
  AcesInputFile in;
  Array2D<Imf_2_5::Rgba> p;
  string local_78;
  Header h;
  
  p._sizeX = 0;
  p._sizeY = 0;
  p._data = (Rgba *)0x0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  Imf_2_5::Header::Header(&h,0x40,0x40,1.0,(V2f *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION);
  poVar2 = std::operator<<((ostream *)&std::cout,"Reading file ");
  poVar2 = std::operator<<(poVar2,inFileName);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,inFileName,&local_a9);
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::AcesInputFile::AcesInputFile(&in,&local_78,iVar1);
  std::__cxx11::string::~string((string *)&local_78);
  other = Imf_2_5::AcesInputFile::header(&in);
  Imf_2_5::Header::operator=(&h,other);
  pBVar3 = Imf_2_5::Header::dataWindow(&h);
  lVar4 = (long)(pBVar3->min).x;
  iVar1 = (pBVar3->min).y;
  scanLine2 = (pBVar3->max).y;
  yStride = ((pBVar3->max).x - lVar4) + 1;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase(&p,(long)((scanLine2 - iVar1) + 1),yStride);
  Imf_2_5::AcesInputFile::setFrameBuffer
            (&in,p._data + (-lVar4 - (long)((int)yStride * iVar1)),1,yStride);
  Imf_2_5::AcesInputFile::readPixels(&in,iVar1,scanLine2);
  Imf_2_5::AcesInputFile::~AcesInputFile(&in);
  Imf_2_5::Header::~Header(&h);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&p);
  return;
}

Assistant:

void
readImage (const char inFileName[])
{
	Array2D<Rgba> p;
	Header h;
	Box2i dw;
	int width;
	int height;

	{
		cout << "Reading file " << inFileName << endl;

		AcesInputFile in (inFileName);

		h = in.header();
		dw = h.dataWindow();

		width  = dw.max.x - dw.min.x + 1;
		height = dw.max.y - dw.min.y + 1;
		p.resizeErase (height, width);

		in.setFrameBuffer (&p[0][0] - dw.min.x - dw.min.y * width, 1, width);
		in.readPixels (dw.min.y, dw.max.y);
	}
}